

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O0

void __thiscall
optTyped_copyAssignmentEmptyForNotEmpty_Test<mp::opt<bool,_mp::opt_default_policy<bool>_>_>::
optTyped_copyAssignmentEmptyForNotEmpty_Test
          (optTyped_copyAssignmentEmptyForNotEmpty_Test<mp::opt<bool,_mp::opt_default_policy<bool>_>_>
           *this)

{
  optTyped_copyAssignmentEmptyForNotEmpty_Test<mp::opt<bool,_mp::opt_default_policy<bool>_>_>
  *this_local;
  
  anon_unknown.dwarf_dc07::optTyped<mp::opt<bool,_mp::opt_default_policy<bool>_>_>::optTyped
            (&this->super_optTyped<mp::opt<bool,_mp::opt_default_policy<bool>_>_>);
  (this->super_optTyped<mp::opt<bool,_mp::opt_default_policy<bool>_>_>).super_Test._vptr_Test =
       (_func_int **)&PTR__optTyped_copyAssignmentEmptyForNotEmpty_Test_00261a70;
  return;
}

Assistant:

TYPED_TEST(optTyped, copyAssignmentEmptyForNotEmpty)
{
  using opt_type = typename TestFixture::type;
  opt_type o1;
  opt_type o2{this->value_1};
  o2 = o1;
  EXPECT_FALSE(o2);
  EXPECT_FALSE(o2.has_value());
  EXPECT_THROW(o2.value(), bad_optional_access);
  EXPECT_EQ(this->value_2, o2.value_or(this->value_2));
}